

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_3dVector * __thiscall
ON_SubDEdgePtr::RelativeDirection(ON_3dVector *__return_storage_ptr__,ON_SubDEdgePtr *this)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_3dPoint OStack_58;
  ON_3dPoint local_40;
  
  uVar3 = this->m_ptr & 0xfffffffffffffff8;
  if (((uVar3 == 0) || (*(long *)(uVar3 + 0x80) == 0)) || (*(long *)(uVar3 + 0x88) == 0)) {
    __return_storage_ptr__->z = ON_3dVector::NanVector.z;
    dVar1 = ON_3dVector::NanVector.y;
    __return_storage_ptr__->x = ON_3dVector::NanVector.x;
    __return_storage_ptr__->y = dVar1;
  }
  else {
    uVar2 = (uint)this->m_ptr & 1;
    ON_3dPoint::ON_3dPoint(&local_40,(double *)(*(long *)(uVar3 + 0x80 + (ulong)uVar2 * 8) + 0x80));
    ON_3dPoint::ON_3dPoint
              (&OStack_58,(double *)(*(long *)(uVar3 + 0x80 + (ulong)(uVar2 ^ 1) * 8) + 0x80));
    ON_3dPoint::operator-(__return_storage_ptr__,&OStack_58,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDEdgePtr::RelativeDirection() const
{
  for (;;)
  {
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr == edge)
      break;
    if (nullptr == edge->m_vertex[0] || nullptr == edge->m_vertex[1])
      break;
    const int i0 = (0 != ON_SUBD_EDGE_DIRECTION(m_ptr)) ? 1 : 0;
    const ON_3dPoint P0(edge->m_vertex[i0]->m_P);
    const ON_3dPoint P1(edge->m_vertex[1-i0]->m_P);
    return (P1 - P0);
  }
  return ON_3dVector::NanVector;
}